

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O2

Edits * __thiscall icu_63::Edits::copyArray(Edits *this,Edits *other)

{
  uint16_t *puVar1;
  int iVar2;
  
  if (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = this->length;
    if (this->capacity < iVar2) {
      puVar1 = (uint16_t *)uprv_malloc_63((long)iVar2 * 2);
      if (puVar1 == (uint16_t *)0x0) {
        this->length = 0;
        this->delta = 0;
        this->numChanges = 0;
        this->errorCode_ = U_MEMORY_ALLOCATION_ERROR;
        return this;
      }
      releaseArray(this);
      this->array = puVar1;
      iVar2 = this->length;
      this->capacity = iVar2;
    }
    if (0 < iVar2) {
      memcpy(this->array,other->array,(ulong)(uint)(iVar2 * 2));
    }
  }
  else {
    this->numChanges = 0;
    this->length = 0;
    this->delta = 0;
  }
  return this;
}

Assistant:

Edits &Edits::copyArray(const Edits &other) {
    if (U_FAILURE(errorCode_)) {
        length = delta = numChanges = 0;
        return *this;
    }
    if (length > capacity) {
        uint16_t *newArray = (uint16_t *)uprv_malloc((size_t)length * 2);
        if (newArray == nullptr) {
            length = delta = numChanges = 0;
            errorCode_ = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
        releaseArray();
        array = newArray;
        capacity = length;
    }
    if (length > 0) {
        uprv_memcpy(array, other.array, (size_t)length * 2);
    }
    return *this;
}